

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.h
# Opt level: O2

UDate ufmt_getDate_63(UFormattable *fmt,UErrorCode *status)

{
  if (*(int *)(fmt + 5) == 0) {
    return (UDate)fmt[1];
  }
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
  *status = U_INVALID_FORMAT_ERROR;
  return 0.0;
}

Assistant:

inline UDate Formattable::getDate(UErrorCode& status) const {
    if (fType != kDate) {
        if (U_SUCCESS(status)) {
            status = U_INVALID_FORMAT_ERROR;
        }
        return 0;
    }
    return fValue.fDate;
}